

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_set_pos_group2(NJDNode *node,char *str)

{
  char *pcVar1;
  
  free(node->pos_group2);
  if ((str == (char *)0x0) || (*str == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(str);
  }
  node->pos_group2 = pcVar1;
  return;
}

Assistant:

void NJDNode_set_pos_group2(NJDNode * node, const char *str)
{
   if (node->pos_group2 != NULL)
      free(node->pos_group2);
   if (str == NULL || strlen(str) == 0)
      node->pos_group2 = NULL;
   else
      node->pos_group2 = strdup(str);
}